

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void Blindf_on(obj *otmp)

{
  bool bVar1;
  bool bVar2;
  boolean changed;
  boolean already_blind;
  obj *otmp_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar2 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar2 = false;
    if (ublindf != (obj *)0x0) {
      bVar2 = ublindf->oartifact == '\x1d';
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  bVar1 = false;
  if (otmp == uwep) {
    setuwep((obj *)0x0);
  }
  if (otmp == uswapwep) {
    setuswapwep((obj *)0x0);
  }
  if (otmp == uquiver) {
    setuqwep((obj *)0x0);
  }
  setworn(otmp,0x80000);
  discover_cursed_equip(otmp);
  on_msg(otmp,'\x01');
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) || (bVar2)))) {
    if ((bVar2) &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      bVar1 = true;
      pline("You can see!");
    }
  }
  else {
    bVar1 = true;
    if (flags.verbose != '\0') {
      pline("You can\'t see any more.");
    }
    if (uball != (obj *)0x0) {
      set_bc(0);
    }
  }
  if (bVar1) {
    if (((((u.uprops[0x19].intrinsic != 0) || (u.uprops[0x19].extrinsic != 0)) ||
         ((youmonst.data == mons + 0x1e ||
          ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))))) &&
        (u.uprops[0x19].blocked == 0)) ||
       (((u.uprops[0x40].intrinsic != 0 || (u.uprops[0x40].extrinsic != 0)) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)))) {
      see_monsters();
    }
    vision_full_recalc = '\x01';
    iflags.botl = '\x01';
  }
  return;
}

Assistant:

void Blindf_on(struct obj *otmp)
{
	boolean already_blind = Blind, changed = FALSE;

	if (otmp == uwep)
	    setuwep(NULL);
	if (otmp == uswapwep)
	    setuswapwep(NULL);
	if (otmp == uquiver)
	    setuqwep(NULL);
	setworn(otmp, W_TOOL);
	discover_cursed_equip(otmp);
	on_msg(otmp, TRUE);

	if (Blind && !already_blind) {
	    changed = TRUE;
	    if (flags.verbose) pline("You can't see any more.");
	    /* set ball&chain variables before the hero goes blind */
	    if (Punished) set_bc(0);
	} else if (already_blind && !Blind) {
	    changed = TRUE;
	    /* "You are now wearing the Eyes of the Overworld." */
	    pline("You can see!");
	}
	if (changed) {
	    /* blindness has just been toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	    vision_full_recalc = 1;	/* recalc vision limits */
	    iflags.botl = 1;
	}
}